

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O0

void __thiscall
utObjImportExport_import_without_linend_Test::TestBody
          (utObjImportExport_import_without_linend_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_58;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer myImporter;
  utObjImportExport_import_without_linend_Test *this_local;
  
  myImporter.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/OBJ/box_without_lineending.obj"
                        ,0);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(&local_50);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1c1,message);
    testing::internal::AssertHelper::operator=(&local_58,&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utObjImportExport, import_without_linend) {
    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFile(ASSIMP_TEST_MODELS_DIR "/OBJ/box_without_lineending.obj", 0);
    ASSERT_NE(nullptr, scene);
}